

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O0

rx_status rx__str_initialize_va_list(size_t *count,char *s,char *fmt,__va_list_tag *args)

{
  int iVar1;
  int size;
  __va_list_tag *args_local;
  char *fmt_local;
  char *s_local;
  size_t *count_local;
  
  if (count != (size_t *)0x0) {
    if (s == (char *)0x0) {
      iVar1 = vsnprintf((char *)0x0,0,fmt,args);
      if (iVar1 < 0) {
        rx__log(RX_LOG_LEVEL_ALL,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x13f9,"invalid string formatting\n");
        count_local._4_4_ = RX_ERROR;
      }
      else {
        *count = (long)iVar1 + 1;
        count_local._4_4_ = RX_SUCCESS;
      }
    }
    else {
      iVar1 = vsprintf(s,fmt,args);
      if (iVar1 < 0) {
        rx__log(RX_LOG_LEVEL_ALL,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x140a,"unexpected string formatting error\n");
        count_local._4_4_ = RX_ERROR;
      }
      else {
        *count = (long)iVar1 + 1;
        count_local._4_4_ = RX_SUCCESS;
      }
    }
    return count_local._4_4_;
  }
  __assert_fail("count != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x13e2,
                "enum rx_status rx__str_initialize_va_list(size_t *, char *, const char *, struct __va_list_tag *)"
               );
}

Assistant:

static enum rx_status
rx__str_initialize_va_list(size_t *count,
                           char *s,
                           const char *fmt,
                           va_list args)
{
    int size;

    RX_ASSERT(count != NULL);

    if (s == NULL) {
#if defined(RX__PLATFORM_WINDOWS)
        size = _vscprintf(fmt, args);
#elif RX__HAS_NPRINTF
        size = vsnprintf(NULL, 0, fmt, args);
#else
        {
            FILE *file;

            file = fopen("/dev/null", "w");
            if (file == NULL) {
                RX__LOG_DEBUG("could not open `/dev/null`\n");
                return RX_ERROR;
            }

            size = vfprintf(file, fmt, args);
            fclose(file);
        }
#endif

        if (size < 0) {
            RX__LOG_DEBUG("invalid string formatting\n");
            return RX_ERROR;
        }

        *count = (size_t)size + 1;
        return RX_SUCCESS;
    }

#if defined(_MSC_VER)
    #pragma warning(push)
    #pragma warning(disable : 4996)
#endif
    size = vsprintf(s, fmt, args);
#if defined(_MSC_VER)
    #pragma warning(pop)
#endif
    if (size < 0) {
        RX__LOG_DEBUG("unexpected string formatting error\n");
        return RX_ERROR;
    }

    *count = (size_t)size + 1;
    return RX_SUCCESS;
}